

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

BreakpointProbe ** __thiscall
Memory::AllocateArray<Memory::ArenaAllocator,Js::BreakpointProbe*,false>
          (Memory *this,ArenaAllocator *allocator,offset_in_ArenaAllocator_to_subr AllocFunc,
          size_t count)

{
  BreakpointProbe **ppBVar1;
  
  if (count != 0) {
    ppBVar1 = (BreakpointProbe **)
              new__<Memory::ArenaAllocator>
                        (-(ulong)(count >> 0x3d != 0) | count << 3,(ArenaAllocator *)this,
                         (offset_in_ArenaAllocator_to_subr)allocator);
    return ppBVar1;
  }
  return (BreakpointProbe **)0x8;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}